

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textrender.cpp
# Opt level: O0

void __thiscall CTextRender::Shutdown(CTextRender *this)

{
  void *pvVar1;
  long in_RDI;
  CGlyphMap *in_stack_00000010;
  int i;
  undefined4 local_c;
  
  pvVar1 = *(void **)(in_RDI + 0x38);
  if (pvVar1 != (void *)0x0) {
    CGlyphMap::~CGlyphMap(in_stack_00000010);
    operator_delete(pvVar1,0x458);
  }
  FT_Done_FreeType(*(undefined8 *)(in_RDI + 0xd0));
  if (*(long *)(in_RDI + 200) != 0) {
    mem_free((void *)0x142070);
  }
  for (local_c = 0; local_c < 0x10; local_c = local_c + 1) {
    if (*(long *)(in_RDI + 0x40 + (long)local_c * 8) != 0) {
      mem_free((void *)0x1420a5);
    }
  }
  return;
}

Assistant:

void CTextRender::Shutdown()
{
	delete m_pGlyphMap;

	FT_Done_FreeType(m_FTLibrary);

	if(m_paVariants)
		mem_free(m_paVariants);

	for(int i = 0; i < MAX_FACES; ++i)
		if(m_apFontData[i])
			mem_free(m_apFontData[i]);
}